

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O0

void __thiscall
LinkedObjectFile::append_word_to_string(LinkedObjectFile *this,string *dest,LinkedWord *word)

{
  uint uVar1;
  undefined8 uVar2;
  runtime_error *this_00;
  undefined4 *in_RDX;
  string *in_RSI;
  char buff [128];
  size_type in_stack_fffffffffffffef8;
  vector<Label,_std::allocator<Label>_> *in_stack_ffffffffffffff00;
  char *__s;
  char local_98 [136];
  string *local_10;
  
  local_10 = in_RSI;
  switch(*in_RDX) {
  case 0:
    sprintf(local_98,"    .word 0x%x\n",(ulong)(uint)in_RDX[1]);
    break;
  case 1:
    std::vector<Label,_std::allocator<Label>_>::at
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    uVar2 = std::__cxx11::string::c_str();
    sprintf(local_98,"    .word %s\n",uVar2);
    break;
  case 2:
    uVar1 = in_RDX[1];
    std::vector<Label,_std::allocator<Label>_>::at
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    uVar2 = std::__cxx11::string::c_str();
    sprintf(local_98,"    .ptr-hi 0x%x %s\n",(ulong)(uVar1 >> 0x10),uVar2);
    break;
  case 3:
    uVar1 = in_RDX[1];
    std::vector<Label,_std::allocator<Label>_>::at
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    uVar2 = std::__cxx11::string::c_str();
    sprintf(local_98,"    .ptr-lo 0x%x %s\n",(ulong)(uVar1 >> 0x10),uVar2);
    break;
  case 4:
    uVar2 = std::__cxx11::string::c_str();
    sprintf(local_98,"    .symbol %s\n",uVar2);
    break;
  case 5:
    sprintf(local_98,"    .empty-list\n");
    break;
  case 6:
    __s = local_98;
    uVar1 = in_RDX[1];
    uVar2 = std::__cxx11::string::c_str();
    sprintf(__s,"    .sym-off 0x%x %s\n",(ulong)(uVar1 >> 0x10),uVar2);
    break;
  case 7:
    uVar2 = std::__cxx11::string::c_str();
    sprintf(local_98,"    .type %s\n",uVar2);
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"nyi");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::operator+=(local_10,local_98);
  return;
}

Assistant:

void LinkedObjectFile::append_word_to_string(std::string& dest, const LinkedWord& word) const {
  char buff[128];

  switch (word.kind) {
    case LinkedWord::PLAIN_DATA:
      sprintf(buff, "    .word 0x%x\n", word.data);
      break;
    case LinkedWord::PTR:
      sprintf(buff, "    .word %s\n", labels.at(word.label_id).name.c_str());
      break;
    case LinkedWord::SYM_PTR:
      sprintf(buff, "    .symbol %s\n", word.symbol_name.c_str());
      break;
    case LinkedWord::TYPE_PTR:
      sprintf(buff, "    .type %s\n", word.symbol_name.c_str());
      break;
    case LinkedWord::EMPTY_PTR:
      sprintf(buff, "    .empty-list\n");  // ?
      break;
    case LinkedWord::HI_PTR:
      sprintf(buff, "    .ptr-hi 0x%x %s\n", word.data >> 16,
              labels.at(word.label_id).name.c_str());
      break;
    case LinkedWord::LO_PTR:
      sprintf(buff, "    .ptr-lo 0x%x %s\n", word.data >> 16,
              labels.at(word.label_id).name.c_str());
      break;
    case LinkedWord::SYM_OFFSET:
      sprintf(buff, "    .sym-off 0x%x %s\n", word.data >> 16, word.symbol_name.c_str());
      break;
    default:
      throw std::runtime_error("nyi");
  }

  dest += buff;
}